

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O3

mz_bool mz_zip_reader_extract_to_file
                  (mz_zip_archive *pZip,mz_uint file_index,char *pDst_filename,mz_uint flags)

{
  mz_bool mVar1;
  int iVar2;
  FILE *__stream;
  mz_bool mVar3;
  mz_bool mVar4;
  mz_zip_archive_file_stat file_stat;
  utimbuf local_498;
  mz_zip_archive_file_stat local_488;
  
  mVar1 = mz_zip_reader_file_stat(pZip,file_index,&local_488);
  mVar3 = 0;
  mVar4 = 0;
  if (mVar1 != 0) {
    mVar4 = mVar3;
    if ((local_488.m_is_directory == 0) && (local_488.m_is_supported != 0)) {
      __stream = fopen64(pDst_filename,"wb");
      if (__stream == (FILE *)0x0) {
        if (pZip != (mz_zip_archive *)0x0) {
          pZip->m_last_error = MZ_ZIP_FILE_OPEN_FAILED;
        }
      }
      else {
        mVar1 = mz_zip_reader_extract_to_callback
                          (pZip,file_index,mz_zip_file_write_callback,__stream,flags);
        iVar2 = fclose(__stream);
        if (iVar2 == -1) {
          if (pZip != (mz_zip_archive *)0x0 && mVar1 != 0) {
            pZip->m_last_error = MZ_ZIP_FILE_CLOSE_FAILED;
          }
        }
        else if (mVar1 != 0) {
          local_498.actime = local_488.m_time;
          local_498.modtime = local_488.m_time;
          utime(pDst_filename,&local_498);
          mVar4 = 1;
        }
      }
    }
    else if (pZip != (mz_zip_archive *)0x0) {
      pZip->m_last_error = MZ_ZIP_UNSUPPORTED_FEATURE;
    }
  }
  return mVar4;
}

Assistant:

mz_bool mz_zip_reader_extract_to_file(mz_zip_archive *pZip, mz_uint file_index,
                                      const char *pDst_filename,
                                      mz_uint flags) {
  mz_bool status;
  mz_zip_archive_file_stat file_stat;
  MZ_FILE *pFile;

  if (!mz_zip_reader_file_stat(pZip, file_index, &file_stat))
    return MZ_FALSE;

  if (file_stat.m_is_directory || (!file_stat.m_is_supported))
    return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_FEATURE);

  pFile = MZ_FOPEN(pDst_filename, "wb");
  if (!pFile)
    return mz_zip_set_error(pZip, MZ_ZIP_FILE_OPEN_FAILED);

  status = mz_zip_reader_extract_to_callback(
      pZip, file_index, mz_zip_file_write_callback, pFile, flags);

  if (MZ_FCLOSE(pFile) == EOF) {
    if (status)
      mz_zip_set_error(pZip, MZ_ZIP_FILE_CLOSE_FAILED);

    status = MZ_FALSE;
  }

#if !defined(MINIZ_NO_TIME) && !defined(MINIZ_NO_STDIO)
  if (status)
    mz_zip_set_file_times(pDst_filename, file_stat.m_time, file_stat.m_time);
#endif

  return status;
}